

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O1

int poptSaneFile(char *fn)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  stat sb;
  stat local_a0;
  
  uVar3 = 0;
  if (fn != (char *)0x0) {
    pcVar2 = strstr(fn,".rpmnew");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(fn,".rpmsave");
      if (pcVar2 == (char *)0x0) {
        iVar1 = stat(fn,&local_a0);
        uVar3 = 0;
        if ((iVar1 != -1) && ((local_a0.st_mode & 0xf000) == 0x8000)) {
          uVar3 = (uint)((local_a0.st_mode & 0x49) == 0);
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int poptSaneFile(const char * fn)
{
    struct stat sb;

    if (fn == NULL || strstr(fn, ".rpmnew") || strstr(fn, ".rpmsave"))
	return 0;
    if (stat(fn, &sb) == -1)
	return 0;
    if (!S_ISREG(sb.st_mode))
	return 0;
    if (sb.st_mode & (S_IXUSR|S_IXGRP|S_IXOTH))
	return 0;
    return 1;
}